

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O1

CTcDataStream * CTcSymObjBase::get_stream_from_meta(tc_metaclass_t meta)

{
  CTcDataStream **ppCVar1;
  
  if (meta == TC_META_ICMOD) {
    ppCVar1 = &G_icmod_stream;
  }
  else {
    if (meta != TC_META_TADSOBJ) {
      return (CTcDataStream *)0x0;
    }
    ppCVar1 = &G_os;
  }
  return *ppCVar1;
}

Assistant:

CTcDataStream *CTcSymObjBase::get_stream_from_meta(tc_metaclass_t meta)
{
    switch(meta)
    {
    case TC_META_TADSOBJ:
        /* it's the regular object stream */
        return G_os;

    case TC_META_ICMOD:
        /* intrinsic class modifier stream */
        return G_icmod_stream;

    default:
        /* other metaclasses have no stream */
        return 0;
    }
}